

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

Result __thiscall tonk::gateway::AsioHost::Initialize(AsioHost *this)

{
  io_context *this_00;
  _Head_base<0UL,_asio::io_context_*,_false> _Var1;
  pointer __p;
  Result *success;
  AsioHost *in_RSI;
  _Head_base<0UL,_asio::io_context_*,_false> local_40;
  undefined8 local_38;
  AsioHost *local_30;
  pointer local_28;
  
  MakeUniqueNoThrow<asio::io_context>();
  _Var1._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (io_context *)0x0;
  std::__uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>::reset
            ((__uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_> *)
             &in_RSI->Context,_Var1._M_head_impl);
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::~unique_ptr
            ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)&local_40);
  this_00 = (in_RSI->Context)._M_t.
            super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
            super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
            super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  if (this_00 != (io_context *)0x0) {
    asio::io_context::restart(this_00);
    MakeUniqueNoThrow<asio::io_context::strand,asio::io_context&>
              ((tonk *)&local_40,
               (in_RSI->Context)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
    _Var1._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (io_context *)0x0;
    std::__uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
    reset((__uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
           *)&in_RSI->AsioEventStrand,(pointer)_Var1._M_head_impl);
    std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
    ~unique_ptr((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
                 *)&local_40);
    MakeUniqueNoThrow<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,asio::io_context&>
              ((tonk *)&local_40,
               (in_RSI->Context)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
    _Var1._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (io_context *)0x0;
    std::
    __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
             *)&in_RSI->Ticker,(pointer)_Var1._M_head_impl);
    std::
    unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                   *)&local_40);
    if (((in_RSI->Ticker)._M_t.
         super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         .
         super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
         ._M_head_impl !=
         (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *)0x0) &&
       ((in_RSI->AsioEventStrand)._M_t.
        super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
        ._M_t.
        super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
        .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl != (strand *)0x0)) {
      TickAndPostNextTimer(in_RSI);
      LOCK();
      (in_RSI->Terminated)._M_base._M_i = false;
      UNLOCK();
      local_40._M_head_impl = (io_context *)WorkerLoop;
      local_38 = 0;
      MakeUniqueNoThrow<std::thread,void(tonk::gateway::AsioHost::*)(),tonk::gateway::AsioHost*>
                ((tonk *)&local_28,(type *)&local_40,&local_30);
      __p = local_28;
      local_28 = (pointer)0x0;
      std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                 &in_RSI->AsioThread,__p);
      std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
                ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_28);
      if ((in_RSI->AsioThread)._M_t.
          super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
          super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
        this->State = (StateMachine *)0x0;
        return (Result)(ErrorResult *)this;
      }
    }
  }
  Result::OutOfMemory();
  return (Result)(ErrorResult *)this;
}

Assistant:

Result AsioHost::Initialize()
{
    Context = MakeUniqueNoThrow<asio::io_context>();
    if (!Context) {
        return Result::OutOfMemory();
    }
    Context->restart();

    AsioEventStrand = MakeUniqueNoThrow<asio::io_context::strand>(*Context);
    Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Context);
    if (!Ticker || !AsioEventStrand) {
        return Result::OutOfMemory();
    }

    /*
        Asio bug work-around: If we do not keep some work queued for Asio it
        will internally call stop() for some reason and then use a ton of
        CPU expecting us to end our worker threads.  The best way I've found
        to prevent the work-queue to go to 0 items is to keep a timer queued
        from before the first worker starts running.  The timer OnTick()
        keeps re-queuing a timer tick so the work-queue is never empty.
    */
    TickAndPostNextTimer();

    Terminated = false;
    AsioThread = MakeUniqueNoThrow<std::thread>(&AsioHost::WorkerLoop, this);
    if (!AsioThread) {
        return Result::OutOfMemory();
    }

    return Result::Success();
}